

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BasicReporter::StartSection(BasicReporter *this,string *sectionName,string *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  SpanInfo local_40;
  
  paVar1 = &local_40.name.field_2;
  pcVar2 = (sectionName->_M_dataplus)._M_p;
  local_40.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + sectionName->_M_string_length);
  local_40.emitted = false;
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  emplace_back<Catch::BasicReporter::SpanInfo>(&this->m_sectionSpans,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

virtual void StartSection( const std::string& sectionName, const std::string& ) {
            m_sectionSpans.push_back( SpanInfo( sectionName ) );
        }